

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

double mjs::to_number(value *v)

{
  wostream *pwVar1;
  char *pcVar2;
  double dVar3;
  wostringstream _woss;
  wstring_view local_198;
  value local_188 [9];
  
  switch(v->type_) {
  case undefined:
    dVar3 = NAN;
    break;
  case boolean:
    if ((v->field_1).b_ != false) {
      return 1.0;
    }
  case null:
    dVar3 = 0.0;
    break;
  case number:
    dVar3 = (v->field_1).n_;
    break;
  case string:
    dVar3 = to_number(&(v->field_1).s_);
    return dVar3;
  case object:
    to_primitive(local_188,v,number);
    dVar3 = to_number(local_188);
    value::destroy(local_188);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_188);
    pwVar1 = std::operator<<((wostream *)local_188,"Not implemented: ");
    pcVar2 = string_value(v->type_);
    std::operator<<(pwVar1,pcVar2);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0xa4);
  }
  return dVar3;
}

Assistant:

double to_number(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return NAN;
    case value_type::null:      return +0.0;
    case value_type::boolean:   return v.boolean_value() ? 1.0 : +0.0;
    case value_type::number:    return v.number_value();
    case value_type::string:    return to_number(v.string_value());
    case value_type::object:    return to_number(to_primitive(v, value_type::number));
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}